

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O3

void __thiscall
google::protobuf::MessageLite::CheckTypeAndMergeFrom(MessageLite *this,MessageLite *other)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Nonnull<const_char_*> failure_msg;
  LogMessage *this_00;
  string_view str;
  string_view sVar2;
  LogMessage LStack_28;
  void *v1;
  
  iVar1 = (*this->_vptr_MessageLite[4])();
  v1 = (void *)CONCAT44(extraout_var,iVar1);
  iVar1 = (*other->_vptr_MessageLite[4])(other);
  if (v1 == (void *)CONCAT44(extraout_var_00,iVar1)) {
    (**(code **)((long)v1 + 0x20))(this,other);
    return;
  }
  failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<void_const*,void_const*>
                          (v1,(void *)CONCAT44(extraout_var_00,iVar1),"data == other_data");
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&LStack_28,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message_lite.cc"
             ,0x51,failure_msg);
  sVar2._M_str = "Invalid call to CheckTypeAndMergeFrom between types ";
  sVar2._M_len = 0x34;
  absl::lts_20250127::log_internal::LogMessage::
  CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(&LStack_28,sVar2)
  ;
  sVar2 = GetTypeName(this);
  this_00 = absl::lts_20250127::log_internal::LogMessage::operator<<(&LStack_28,sVar2);
  str._M_str = " and ";
  str._M_len = 5;
  absl::lts_20250127::log_internal::LogMessage::
  CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(this_00,str);
  sVar2 = GetTypeName(other);
  absl::lts_20250127::log_internal::LogMessage::operator<<(this_00,sVar2);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&LStack_28)
  ;
}

Assistant:

void MessageLite::CheckTypeAndMergeFrom(const MessageLite& other) {
  auto* data = GetClassData();
  auto* other_data = other.GetClassData();

  ABSL_CHECK_EQ(data, other_data)
      << "Invalid call to CheckTypeAndMergeFrom between types " << GetTypeName()
      << " and " << other.GetTypeName();
  data->merge_to_from(*this, other);
}